

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Str_t * Pdr_ManDumpString(Pdr_Man_t *p)

{
  uint kStart;
  Vec_Str_t *p_00;
  Vec_Ptr_t *p_01;
  Pdr_Set_t *p_02;
  _func_int_varargs *in_RSI;
  int i;
  Vec_Int_t *vFlopCounts_00;
  Vec_Int_t *vFlopCounts;
  Vec_Int_t *local_30;
  
  p_00 = Vec_StrAlloc((int)p);
  kStart = Pdr_ManFindInvariantStart(p);
  if (p->vInfCubes == (Vec_Ptr_t *)0x0) {
    in_RSI = (_func_int_varargs *)(ulong)kStart;
    p_01 = Pdr_ManCollectCubes(p,kStart);
  }
  else {
    p_01 = Vec_PtrDup(p->vInfCubes);
  }
  Vec_PtrSort(p_01,in_RSI);
  i = 0;
  if (p->pPars->fUseSupp == 0) {
    local_30 = (Vec_Int_t *)0x0;
    vFlopCounts_00 = local_30;
  }
  else {
    local_30 = Pdr_ManCountFlops(p,p_01);
    vFlopCounts_00 = local_30;
  }
  for (; i < p_01->nSize; i = i + 1) {
    p_02 = (Pdr_Set_t *)Vec_PtrEntry(p_01,i);
    if (p_02->nRefs != -1) {
      Pdr_SetPrintStr(p_00,p_02,p->pAig->nRegs,vFlopCounts_00);
    }
  }
  Vec_IntFreeP(&local_30);
  Vec_PtrFree(p_01);
  Vec_StrPush(p_00,'\0');
  return p_00;
}

Assistant:

Vec_Str_t * Pdr_ManDumpString( Pdr_Man_t * p )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart;
    vStr = Vec_StrAlloc( 1000 );
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( p->vInfCubes == NULL )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
    // collect variable appearances
    vFlopCounts = p->pPars->fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrintStr( vStr, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
    }
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}